

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O3

void __thiscall
icu_63::numparse::impl::CodePointMatcherWarehouse::CodePointMatcherWarehouse
          (CodePointMatcherWarehouse *this,CodePointMatcherWarehouse *src)

{
  CodePointMatcher **__src;
  int iVar1;
  CodePointMatcher **ppCVar2;
  int32_t iVar3;
  long lVar4;
  
  lVar4 = 0x10;
  do {
    *(undefined ***)((long)((this->codePoints)._M_elems + -1) + lVar4) =
         &PTR__NumberParseMatcher_003b62b0;
    *(undefined4 *)((long)(this->codePoints)._M_elems + lVar4 + -8) =
         *(undefined4 *)((long)(src->codePoints)._M_elems + lVar4 + -8);
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x60);
  ppCVar2 = (src->codePointsOverflow).ptr;
  (this->codePointsOverflow).ptr = ppCVar2;
  iVar1 = (src->codePointsOverflow).capacity;
  (this->codePointsOverflow).capacity = iVar1;
  (this->codePointsOverflow).needToRelease = (src->codePointsOverflow).needToRelease;
  __src = (src->codePointsOverflow).stackArray;
  if (ppCVar2 == __src) {
    ppCVar2 = (this->codePointsOverflow).stackArray;
    (this->codePointsOverflow).ptr = ppCVar2;
    memcpy(ppCVar2,__src,(long)iVar1 << 3);
  }
  else {
    (src->codePointsOverflow).ptr = __src;
    (src->codePointsOverflow).capacity = 3;
    (src->codePointsOverflow).needToRelease = '\0';
  }
  iVar3 = src->codePointNumBatches;
  this->codePointCount = src->codePointCount;
  this->codePointNumBatches = iVar3;
  return;
}

Assistant:

CodePointMatcherWarehouse::CodePointMatcherWarehouse(CodePointMatcherWarehouse&& src) U_NOEXCEPT
        : codePoints(std::move(src.codePoints)),
          codePointsOverflow(std::move(src.codePointsOverflow)),
          codePointCount(src.codePointCount),
          codePointNumBatches(src.codePointNumBatches) {}